

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting_settings.cpp
# Opt level: O2

bool get_fitting_settings_from_command_line(fitting_settings *output,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  logic_error *plVar5;
  string *psVar6;
  long lVar7;
  float fVar8;
  string argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  stringstream ss;
  ostream local_1a8 [8];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [18];
  
  local_1a0._M_p = (pointer)&local_190;
  _ss = normal;
  local_198 = 0;
  local_190._M_local_buf[0] = '\0';
  local_180._M_p = (pointer)&local_170;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  local_160._M_p = (pointer)local_150;
  local_158 = 0;
  local_150[0]._M_local_buf[0] = '\0';
  fitting_settings::operator=(output,(fitting_settings *)&ss);
  fitting_settings::~fitting_settings((fitting_settings *)&ss);
  std::__cxx11::string::assign((char *)&output->brdf_method);
  output->resolution = 0x40;
  output->min_roughness = 0.0001;
  output->max_roughness = 1.0;
  output->num_error_estimate_samples = 0x20;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_1a8,"result_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,output->resolution);
  poVar3 = std::operator<<(poVar3,"x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,output->resolution);
  std::operator<<(poVar3,".ltc");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&output->output_file,(string *)&argument);
  std::__cxx11::string::~string((string *)&argument);
  lVar7 = 1;
  do {
    if (argc <= lVar7) {
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argument,argv[lVar7],(allocator<char> *)&key);
    poVar3 = std::operator<<((ostream *)&std::cout,"arg: ");
    poVar3 = std::operator<<(poVar3,(string *)&argument);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::substr((ulong)&key,(ulong)&argument);
    bVar1 = std::operator!=(&key,"--");
    std::__cxx11::string::~string((string *)&key);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unrecognized argument \"");
      poVar3 = std::operator<<(poVar3,(string *)&argument);
      std::operator<<(poVar3,"\". Aborting.");
      plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar5,"Unrecognized argument.");
      __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar4 = std::__cxx11::string::find((char)&argument,0x3d);
    if (lVar4 == -1) {
      plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar5,"Argument assignment has assignment operator.");
      __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::__cxx11::string::substr((ulong)&key,(ulong)&argument);
    std::__cxx11::string::substr((ulong)&value,(ulong)&argument);
    bVar1 = std::operator==(&key,"brdf");
    psVar6 = (string *)&output->brdf_method;
    if (bVar1) {
LAB_00145c19:
      std::__cxx11::string::_M_assign(psVar6);
    }
    else {
      bVar1 = std::operator==(&key,"resolution");
      if (bVar1) {
        iVar2 = std::__cxx11::stoi(&value,(size_t *)0x0,10);
        output->resolution = iVar2;
      }
      else {
        bVar1 = std::operator==(&key,"min-roughness");
        if (bVar1) {
          fVar8 = std::__cxx11::stof(&value,(size_t *)0x0);
          output->min_roughness = fVar8;
        }
        else {
          bVar1 = std::operator==(&key,"output");
          psVar6 = (string *)&output->output_file;
          if (bVar1) goto LAB_00145c19;
        }
      }
    }
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&argument);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

bool get_fitting_settings_from_command_line(
  fitting_settings &output,
  int argc,
  const char *argv[]
)
{
  output = fitting_settings();

  output.brdf_method = "ggx";
  output.resolution = 64;
  output.min_roughness = 0.0001f;
  output.max_roughness = 1.0f;
  output.num_error_estimate_samples = 32;

  std::stringstream ss;
  ss << "result_" << output.resolution << "x" << output.resolution << ".ltc";
  output.output_file = ss.str();

  for (auto argId = 1; argId < argc; ++argId) {
    std::string argument = argv[argId];
    std::cout << "arg: " << argument << std::endl;
    if (argument.substr(0, 2) != "--") {
      std::cerr << "Unrecognized argument \"" << argument << "\". Aborting.";
      throw std::logic_error("Unrecognized argument.");
    }

    auto assignmentOperator = argument.find_first_of('=');
    if (assignmentOperator == -1) {
      throw std::logic_error("Argument assignment has assignment operator.");
    }

    auto key = argument.substr(2, assignmentOperator - 2);
    auto value = argument.substr(assignmentOperator + 1, argument.length() - assignmentOperator - 1);

    if (key == "brdf") {
      output.brdf_method = value;
    }
    else if (key == "resolution") {
      output.resolution = std::stoi(value);
    }
    else if (key == "min-roughness") {
      output.min_roughness = std::stof(value);
    }
    else if (key == "output") {
      output.output_file = value;
    }
  }

  return true;
}